

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
::write_decimal<unsigned_int>
          (arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
           *this,uint value)

{
  ulong uVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  bool bVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  buffer<char> *c;
  
  uVar6 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar7 = (ulong)((uVar6 - (value < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                             (ulong)uVar6 * 4))) + 1);
  pbVar2 = (this->out_).container;
  sVar3 = pbVar2->size_;
  uVar1 = sVar3 + uVar7;
  if (pbVar2->capacity_ < uVar1) {
    (**pbVar2->_vptr_buffer)(pbVar2,uVar1);
  }
  pbVar2->size_ = uVar1;
  pcVar5 = pbVar2->ptr_ + uVar7 + sVar3;
  uVar6 = value;
  if (99 < value) {
    do {
      value = uVar6 / 100;
      *(undefined2 *)(pcVar5 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar6 % 100) * 2);
      pcVar5 = pcVar5 + -2;
      bVar4 = 9999 < uVar6;
      uVar6 = uVar6 / 100;
    } while (bVar4);
  }
  if (value < 10) {
    pcVar5[-1] = (byte)value | 0x30;
  }
  else {
    *(undefined2 *)(pcVar5 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)value * 2);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }